

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  word *pwVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  char *extraout_RDX;
  char *pcVar9;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  ulong uVar10;
  WirePointer *pWVar11;
  WirePointer *pWVar12;
  uint uVar13;
  WirePointer *pWVar14;
  bool bVar15;
  Reader RVar16;
  SegmentReader *newSegment;
  WirePointer *local_70;
  SegmentReader *local_68;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  pWVar11 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar11 = this->pointer;
  }
  if (0x1fffffff < defaultSize) {
    kj::ThrowOverflow::operator()((ThrowOverflow *)&_kjCondition);
  }
  local_68 = this->segment;
  pWVar12 = pWVar11 + 1;
  lVar8 = (long)((int)(pWVar11->offsetAndKind).value >> 2);
  if (local_68 == (SegmentReader *)0x0) {
    pWVar14 = pWVar12 + lVar8;
  }
  else {
    pwVar1 = (local_68->ptr).ptr;
    pWVar14 = (WirePointer *)(pwVar1 + (local_68->ptr).size_);
    if (((long)pwVar1 - (long)pWVar12 >> 3 <= lVar8) &&
       (lVar8 <= (long)pWVar14 - (long)pWVar12 >> 3)) {
      pWVar14 = pWVar12 + lVar8;
    }
  }
  uVar13 = (pWVar11->offsetAndKind).value;
  uVar7 = (pWVar11->field_1).upper32Bits | uVar13;
  pcVar9 = (char *)(ulong)uVar7;
  if (uVar7 != 0) {
    pWVar12 = pWVar11;
    if ((local_68 != (SegmentReader *)0x0) && ((uVar13 & 3) == 2)) {
      iVar4 = (*local_68->arena->_vptr_Arena[2])();
      local_68 = (SegmentReader *)CONCAT44(extraout_var,iVar4);
      _kjCondition.left = &local_68;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_68 != (SegmentReader *)0x0;
      if (local_68 == (SegmentReader *)0x0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
        kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
        pcVar9 = extraout_RDX;
        pWVar14 = (WirePointer *)0x0;
      }
      else {
        uVar13 = (pWVar11->offsetAndKind).value;
        uVar5 = (ulong)(uVar13 >> 3);
        uVar6 = (local_68->ptr).size_;
        if ((long)uVar6 < (long)uVar5) {
          uVar5 = uVar6;
        }
        pWVar12 = (WirePointer *)((local_68->ptr).ptr + uVar5);
        local_70 = (WirePointer *)defaultValue;
        if (local_68 == (SegmentReader *)0x0) {
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_0015f7a1:
          if (((pWVar11->offsetAndKind).value & 4) == 0) {
            pWVar11 = pWVar12 + 1;
            lVar8 = (long)((int)(pWVar12->offsetAndKind).value >> 2);
            defaultValue = local_70;
            if (local_68 == (SegmentReader *)0x0) {
              pcVar9 = (char *)0x0;
              pWVar14 = pWVar11 + lVar8;
            }
            else {
              pwVar1 = (local_68->ptr).ptr;
              pcVar9 = (char *)(local_68->ptr).size_;
              pWVar14 = (WirePointer *)(pwVar1 + (long)pcVar9);
              if ((long)pwVar1 - (long)pWVar11 >> 3 <= lVar8) {
                pcVar9 = (char *)((long)pWVar14 - (long)pWVar11 >> 3);
                if (lVar8 <= (long)pcVar9) {
                  pWVar14 = pWVar11 + lVar8;
                }
              }
            }
          }
          else {
            iVar4 = (*local_68->arena->_vptr_Arena[2])
                              (local_68->arena,(ulong)(pWVar12->field_1).upper32Bits);
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = newSegment != (SegmentReader *)0x0;
            if (newSegment == (SegmentReader *)0x0) {
              _kjCondition.left = &newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0015f95e:
              pWVar14 = (WirePointer *)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
              pcVar9 = extraout_RDX_01;
            }
            else {
              uVar13 = (pWVar12->offsetAndKind).value & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar13);
              pcVar9 = " == ";
              _kjCondition.right = anon_var_dwarf_22597;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar13 == 2);
              if (uVar13 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_0015f95e;
              }
              uVar6 = (ulong)((pWVar12->offsetAndKind).value >> 3);
              sVar2 = (newSegment->ptr).size_;
              if ((long)sVar2 < (long)uVar6) {
                uVar6 = sVar2;
              }
              pWVar14 = (WirePointer *)((newSegment->ptr).ptr + uVar6);
              local_68 = newSegment;
            }
            pWVar12 = pWVar12 + 1;
            defaultValue = local_70;
          }
        }
        else {
          uVar10 = 2 - (ulong)((uVar13 & 4) == 0);
          if (uVar6 < uVar5 + uVar10) {
            newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
          }
          else {
            uVar6 = local_68->readLimiter->limit;
            if (uVar6 < uVar10) {
              (*local_68->arena->_vptr_Arena[3])();
            }
            else {
              local_68->readLimiter->limit = uVar6 - uVar10;
            }
            newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar10 <= uVar6);
            if (uVar10 <= uVar6) goto LAB_0015f7a1;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [318])
                     "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          pcVar9 = extraout_RDX_00;
          pWVar12 = pWVar11;
          defaultValue = local_70;
          pWVar14 = (WirePointer *)0x0;
        }
      }
    }
    if (pWVar14 == (WirePointer *)0x0) {
      cVar3 = (pWVar14 == (WirePointer *)0x0) * '\x02';
    }
    else {
      local_70 = (WirePointer *)(ulong)(pWVar12->field_1).upper32Bits;
      uVar13 = (pWVar12->offsetAndKind).value & 3;
      _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar13);
      _kjCondition.right = anon_var_dwarf_22597;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar13 == 1);
      if (uVar13 == 1) {
        _kjCondition.left =
             (SegmentReader **)
             (CONCAT71(_kjCondition.left._1_7_,*(byte *)&pWVar12->field_1) & 0xffffffffffffff07);
        _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
        _kjCondition.right = anon_var_dwarf_22597;
        _kjCondition.op.content.ptr = (char *)0x5;
        bVar15 = (*(byte *)&pWVar12->field_1 & 7) == 2;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar15);
        if (bVar15) {
          uVar13 = (pWVar12->field_1).upper32Bits >> 3;
          pcVar9 = (char *)(ulong)uVar13;
          if (local_68 == (SegmentReader *)0x0) {
            bVar15 = true;
          }
          else {
            uVar6 = (ulong)(uVar13 + 7 >> 3);
            if ((local_68->ptr).size_ < ((long)pWVar14 - (long)(local_68->ptr).ptr >> 3) + uVar6) {
              bVar15 = false;
            }
            else {
              uVar5 = local_68->readLimiter->limit;
              bVar15 = uVar5 >= uVar6;
              if (uVar5 < uVar6) {
                (*local_68->arena->_vptr_Arena[3])();
              }
              else {
                local_68->readLimiter->limit = uVar5 - uVar6;
              }
            }
          }
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,bVar15);
          cVar3 = '\x01';
          if (bVar15 == false) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9e8,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                       "_kjCondition,\"Message contained out-of-bounds data pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [320])
                       "Message contained out-of-bounds data pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            cVar3 = '\x02';
          }
        }
        else {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9e2,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where data was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where data was expected."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
          cVar3 = '\x02';
          pcVar9 = extraout_RDX_03;
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  ((Fault *)&newSegment,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9dc,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where data was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where data was expected.");
        kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
        cVar3 = '\x02';
        pcVar9 = extraout_RDX_02;
      }
    }
    if (cVar3 != '\x02') goto LAB_0015fb5c;
  }
  pcVar9 = (char *)(ulong)defaultSize;
  pWVar14 = (WirePointer *)defaultValue;
LAB_0015fb5c:
  RVar16.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)pcVar9;
  RVar16.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)pWVar14;
  return (Reader)RVar16.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}